

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O1

void strict_fstream::detail::static_method_holder::check_peek
               (istream *is_p,string *filename,openmode mode)

{
  Exception *this;
  long *plVar1;
  size_type *psVar2;
  int __errnum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::istream::peek();
  if (((&is_p->field_0x20)[(long)is_p->_vptr_basic_istream[-3]] & 5) == 0) {
    std::ios::clear((int)is_p + (int)is_p->_vptr_basic_istream[-3]);
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"strict_fstream: open(\'","");
  std::operator+(&local_90,&local_f0,filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_130._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar2) {
    local_130.field_2._M_allocated_capacity = *psVar2;
    local_130.field_2._8_8_ = plVar1[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar2;
  }
  local_130._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  mode_to_string_abi_cxx11_
            (&local_b0,(static_method_holder *)(ulong)(uint)mode,
             (openmode)local_130._M_string_length);
  std::operator+(&local_70,&local_130,&local_b0);
  __errnum = 0x359ce9;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_110._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar2) {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110.field_2._8_8_ = plVar1[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar2;
  }
  local_110._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  strerror_abi_cxx11_((strict_fstream *)&local_d0,__errnum);
  std::operator+(&local_50,&local_110,&local_d0);
  Exception::Exception(this,&local_50);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void check_peek(std::istream * is_p, const std::string& filename, std::ios_base::openmode mode)
    {
        bool peek_failed = true;
        try
        {
            is_p->peek();
            peek_failed = is_p->fail();
        }
        catch (const std::ios_base::failure &) {}
        if (peek_failed)
        {
            throw Exception(std::string("strict_fstream: open('")
                            + filename + "'," + mode_to_string(mode) + "): peek failed: "
                            + strerror());
        }
        is_p->clear();
    }